

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

int __thiscall QSQLiteDriver::close(QSQLiteDriver *this,int __fd)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QString *descr;
  char cVar4;
  int iVar5;
  sqlite3 *db;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_58;
  Vdbe *local_38;
  
  local_38 = *(Vdbe **)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  cVar4 = (**(code **)(*(long *)this + 0x60))();
  if (cVar4 != '\0') {
    lVar2 = *(long *)(lVar1 + 0xb8);
    lVar3 = *(long *)(lVar1 + 0xc0);
    for (lVar6 = 0; lVar3 << 3 != lVar6; lVar6 = lVar6 + 8) {
      QSQLiteResultPrivate::finalize(*(QSQLiteResultPrivate **)(*(long *)(lVar2 + lVar6) + 8));
    }
    db = *(sqlite3 **)(lVar1 + 0xa8);
    if (db == (sqlite3 *)0x0) {
      db = (sqlite3 *)0x0;
    }
    else if (*(long *)(lVar1 + 0xd8) != 0) {
      QList<QString>::clear((QList<QString> *)(lVar1 + 200));
      sqlite3_update_hook(*(sqlite3 **)(lVar1 + 0xa8),
                          (_func_void_void_ptr_int_char_ptr_char_ptr_sqlite_int64 *)0x0,(void *)0x0)
      ;
      db = *(sqlite3 **)(lVar1 + 0xa8);
    }
    iVar5 = sqlite3_close(db);
    if (iVar5 != 0) {
      descr = *(QString **)(lVar1 + 0xa8);
      tr((QString *)&QStack_58,"Error closing database",(char *)0x0,-1);
      qMakeError((sqlite3 *)&stack0xffffffffffffffc0,descr,(ErrorType)&QStack_58,1);
      (**(code **)(*(long *)this + 0x120))(this,(sqlite3 *)&stack0xffffffffffffffc0);
      QSqlError::~QSqlError((QSqlError *)&stack0xffffffffffffffc0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
    }
    *(undefined8 *)(lVar1 + 0xa8) = 0;
    (**(code **)(*(long *)this + 0x110))(this,0);
    (**(code **)(*(long *)this + 0x118))(this,0);
  }
  if (*(Vdbe **)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(Vdbe **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QSQLiteDriver::close()
{
    Q_D(QSQLiteDriver);
    if (isOpen()) {
        for (QSQLiteResult *result : std::as_const(d->results))
            result->d_func()->finalize();

        if (d->access && (d->notificationid.size() > 0)) {
            d->notificationid.clear();
            sqlite3_update_hook(d->access, nullptr, nullptr);
        }

        const int res = sqlite3_close(d->access);

        if (res != SQLITE_OK)
            setLastError(qMakeError(d->access, tr("Error closing database"), QSqlError::ConnectionError, res));
        d->access = nullptr;
        setOpen(false);
        setOpenError(false);
    }
}